

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O3

sexp_conflict sexp_get_environment_variables(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  char *pcVar1;
  long *plVar2;
  sexp_conflict psVar3;
  char *__s;
  sexp_conflict val;
  sexp_conflict name;
  sexp_conflict local_70;
  sexp_conflict local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_68;
  local_68 = (sexp_conflict)0x43e;
  local_48.var = &local_70;
  local_70 = (sexp_conflict)0x43e;
  local_58.var = &local_60;
  local_38.next = &local_58;
  local_58.next = (ctx->value).context.saves;
  local_48.next = &local_38;
  (ctx->value).context.saves = &local_48;
  local_60 = (sexp_conflict)0x23e;
  __s = (char *)*_environ;
  if (__s == (char *)0x0) {
    psVar3 = (sexp_conflict)0x23e;
  }
  else {
    psVar3 = (sexp_conflict)0x23e;
    plVar2 = _environ;
    do {
      plVar2 = plVar2 + 1;
      pcVar1 = strchr(__s,0x3d);
      if (pcVar1 != (char *)0x0) {
        local_68 = (sexp_conflict)sexp_c_string(ctx,__s,(long)pcVar1 - (long)__s);
        local_70 = (sexp_conflict)sexp_c_string(ctx,pcVar1 + 1,0xffffffffffffffff);
        local_70 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_68,local_70);
        psVar3 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_70,local_60);
        local_60 = psVar3;
      }
      __s = (char *)*plVar2;
    } while (__s != (char *)0x0);
  }
  (ctx->value).context.saves = local_58.next;
  return psVar3;
}

Assistant:

sexp sexp_get_environment_variables (sexp ctx, sexp self, sexp_sint_t n) {
  int i;
  char **env, *cname, *cval;
  sexp_gc_var3(res, name, val);
  sexp_gc_preserve3(ctx, res, name, val);
  res = SEXP_NULL;
#ifndef PLAN9
  env = environ;
  for (i=0; env[i]; i++) {
    cname = env[i];
    cval = strchr(cname, '=');
    if (cval) {
      name = sexp_c_string(ctx, cname, cval-cname);
      val = sexp_c_string(ctx, cval+1, -1);
      val = sexp_cons(ctx, name, val);
      res = sexp_cons(ctx, val, res);
    }
  }
#endif
  sexp_gc_release3(ctx);
  return res;
}